

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O3

float __thiscall ggx::calculate_shadow_masking_term(ggx *this,vec3 *light_dir,vec3 *view_dir)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (0.0 < (light_dir->field_0).field_0.z) {
    fVar1 = lambda(this,(view_dir->field_0).field_0.z);
    fVar2 = lambda(this,(light_dir->field_0).field_0.z);
    fVar1 = 1.0 / (fVar1 + 1.0 + fVar2);
  }
  return fVar1;
}

Assistant:

float ggx::calculate_shadow_masking_term(const glm::vec3 &light_dir, const glm::vec3 &view_dir) const
{
  // See for more details:
  // - Understanding the Masking-Shadowing Function in Microfacet-Based BRDFs
  // - Microfacet Models for Refraction through Rough Surfaces
  // - PBR Diffuse Lighting for GGX+Smith Microsurfaces (Slides)

  if (light_dir.z <= 0.0f)
  {
    return 0.0f;
  }

  const auto lambda_v = lambda(view_dir.z);
  const auto lambda_l = lambda(light_dir.z);

  auto g2 = 1.0f / (1.0f + lambda_v + lambda_l);

  return g2;
}